

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O1

point3d * tinyusdz::vcross(point3d *a,point3d *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  point3d *in_RDI;
  
  dVar1 = b->y;
  dVar2 = b->z;
  dVar3 = a->y;
  dVar4 = a->z;
  in_RDI->x = dVar3 * dVar2 - dVar1 * dVar4;
  dVar5 = b->x;
  dVar6 = a->x;
  in_RDI->y = dVar4 * dVar5 - dVar2 * dVar6;
  in_RDI->z = dVar6 * dVar1 - dVar5 * dVar3;
  return in_RDI;
}

Assistant:

value::point3d vcross(const value::point3d &a, const value::point3d &b)
{
  value::point3d n;
  n[0] = a[1] * b[2] - a[2] * b[1];
  n[1] = a[2] * b[0] - a[0] * b[2];
  n[2] = a[0] * b[1] - a[1] * b[0];

  return n;
}